

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O2

bool __thiscall Rml::BaseXMLParser::ReadCloseTag(BaseXMLParser *this,size_t xml_index_tag)

{
  code *pcVar1;
  bool bVar2;
  String tag_name;
  String local_40;
  
  if ((this->inner_xml_data == true) &&
     (this->open_tag_depth == this->inner_xml_data_terminate_depth)) {
    if ((xml_index_tag < this->inner_xml_data_index_begin) &&
       (bVar2 = Assert("RMLUI_ASSERT(inner_xml_data_index_begin <= xml_index_tag)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/BaseXMLParser.cpp"
                       ,0x12d), !bVar2)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    this->inner_xml_data = false;
    ::std::__cxx11::string::substr((ulong)&tag_name,(ulong)&this->xml_source);
    ::std::__cxx11::string::operator=((string *)&this->data,(string *)&tag_name);
    ::std::__cxx11::string::~string((string *)&tag_name);
    if (this->inner_xml_data == false) {
      (*this->_vptr_BaseXMLParser[4])(this,&this->data,2);
    }
    (this->data)._M_string_length = 0;
    *(this->data)._M_dataplus._M_p = '\0';
  }
  if ((this->data)._M_string_length != 0) {
    if (this->inner_xml_data == false) {
      (*this->_vptr_BaseXMLParser[4])(this,&this->data,0);
    }
    (this->data)._M_string_length = 0;
    *(this->data)._M_dataplus._M_p = '\0';
  }
  tag_name._M_dataplus._M_p = (pointer)&tag_name.field_2;
  tag_name._M_string_length = 0;
  tag_name.field_2._M_local_buf[0] = '\0';
  bVar2 = FindString(this,">",&tag_name,false);
  if (bVar2) {
    StringUtilities::StripWhitespace(&local_40,&tag_name);
    if (this->inner_xml_data == false) {
      (*this->_vptr_BaseXMLParser[3])(this,&local_40);
    }
    ::std::__cxx11::string::~string((string *)&local_40);
    this->open_tag_depth = this->open_tag_depth + -1;
  }
  ::std::__cxx11::string::~string((string *)&tag_name);
  return bVar2;
}

Assistant:

bool BaseXMLParser::ReadCloseTag(const size_t xml_index_tag)
{
	if (inner_xml_data && open_tag_depth == inner_xml_data_terminate_depth)
	{
		// Closing the tag that initiated the inner xml data parsing. Set all its contents as Data to be
		// submitted next, and disable the mode to resume normal parsing behavior.
		RMLUI_ASSERT(inner_xml_data_index_begin <= xml_index_tag);
		inner_xml_data = false;
		data = xml_source.substr(inner_xml_data_index_begin, xml_index_tag - inner_xml_data_index_begin);
		HandleDataInternal(data, XMLDataType::InnerXML);
		data.clear();
	}

	// Closing tag; send data immediately and close the tag.
	if (!data.empty())
	{
		HandleDataInternal(data, XMLDataType::Text);
		data.clear();
	}

	String tag_name;
	if (!FindString(">", tag_name))
		return false;

	HandleElementEndInternal(StringUtilities::StripWhitespace(tag_name));

	// Tag closed, reduce count
	open_tag_depth--;

	return true;
}